

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O2

void Ioa_WriteAiger(Aig_Man_t *pMan,char *pFileName,int fWriteSymbols,int fCompact)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  void *pvVar3;
  Vec_Int_t *vLits;
  Vec_Str_t *p;
  uchar *pBuffer;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t __size;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int local_38;
  
  if (pMan->nObjs[3] == 0) {
    puts("AIG cannot be written because it has no POs.");
    return;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Ioa_WriteAiger(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  (pMan->pConst1->field_5).iData = 0;
  iVar10 = 1;
  while( true ) {
    if (pMan->vCis->nSize <= iVar10 + -1) break;
    pvVar3 = Vec_PtrEntry(pMan->vCis,iVar10 + -1);
    *(int *)((long)pvVar3 + 0x28) = iVar10;
    iVar10 = iVar10 + 1;
  }
  for (iVar11 = 0; iVar11 < pMan->vObjs->nSize; iVar11 = iVar11 + 1) {
    pvVar3 = Vec_PtrEntry(pMan->vObjs,iVar11);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
      *(int *)((long)pvVar3 + 0x28) = iVar10;
      iVar10 = iVar10 + 1;
    }
  }
  pcVar4 = "2";
  if (fCompact == 0) {
    pcVar4 = "";
  }
  uVar1 = pMan->nRegs;
  uVar8 = pMan->nObjs[6] + pMan->nObjs[5];
  uVar9 = 0;
  if (pMan->nConstrs == 0) {
    uVar9 = (ulong)(pMan->nObjs[3] - uVar1);
  }
  fprintf(__stream,"aig%s %u %u %u %u %u",pcVar4,(ulong)(uVar8 + pMan->nObjs[2]),
          (ulong)(pMan->nObjs[2] - uVar1),(ulong)uVar1,uVar9,(ulong)uVar8);
  if (pMan->nConstrs != 0) {
    fprintf(__stream," %u %u",(ulong)(uint)(pMan->nObjs[3] - (pMan->nRegs + pMan->nConstrs)));
  }
  fputc(10,__stream);
  Aig_ManInvertConstraints(pMan);
  if (fCompact == 0) {
    for (iVar10 = pMan->nObjs[3] - pMan->nRegs; iVar10 < pMan->vCos->nSize; iVar10 = iVar10 + 1) {
      pvVar3 = Vec_PtrEntry(pMan->vCos,iVar10);
      iVar11 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28);
      fprintf(__stream,"%u\n",
              (ulong)(((uint)(iVar11 == 0) ^ (uint)*(ulong *)((long)pvVar3 + 8) & 1) + iVar11 * 2));
    }
    for (iVar10 = 0; iVar10 < pMan->nObjs[3] - pMan->nRegs; iVar10 = iVar10 + 1) {
      pvVar3 = Vec_PtrEntry(pMan->vCos,iVar10);
      iVar11 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28);
      fprintf(__stream,"%u\n",
              (ulong)(((uint)(iVar11 == 0) ^ (uint)*(ulong *)((long)pvVar3 + 8) & 1) + iVar11 * 2));
    }
  }
  else {
    vLits = Ioa_WriteAigerLiterals(pMan);
    p = Ioa_WriteEncodeLiterals(vLits);
    fwrite(p->pArray,1,(long)p->nSize,__stream);
    Vec_StrFree(p);
    free(vLits->pArray);
    free(vLits);
  }
  Aig_ManInvertConstraints(pMan);
  lVar6 = ((long)pMan->nObjs[6] + (long)pMan->nObjs[5]) * 6;
  __size = lVar6 + 100;
  pBuffer = (uchar *)malloc(__size);
  iVar10 = 0;
  iVar11 = 0;
  do {
    if (pMan->vObjs->nSize <= iVar11) {
      local_38 = (int)__size;
      if (local_38 <= iVar10) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ioa/ioaWriteAig.c"
                      ,0x22c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
      }
      fwrite(pBuffer,1,(long)iVar10,__stream);
      free(pBuffer);
      fputc(99,__stream);
      if (pMan->pName != (char *)0x0) {
        fprintf(__stream,"n%s%c",pMan->pName,0);
      }
      pcVar4 = Ioa_TimeStamp();
      fprintf(__stream,"\nThis file was produced by the IOA package in ABC on %s\n",pcVar4);
      fprintf(__stream,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger"
             );
LAB_0060a9e8:
      fclose(__stream);
      return;
    }
    pvVar3 = Vec_PtrEntry(pMan->vObjs,iVar11);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
      uVar1 = ((uint)*(ulong *)((long)pvVar3 + 8) & 1) +
              *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28) * 2;
      uVar8 = ((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) +
              *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x28) * 2;
      if (uVar1 == uVar8) {
        __assert_fail("uLit0 != uLit1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ioa/ioaWriteAig.c"
                      ,0x21c,"void Ioa_WriteAiger(Aig_Man_t *, char *, int, int)");
      }
      uVar2 = uVar8;
      if (uVar8 < uVar1) {
        uVar2 = uVar1;
      }
      iVar10 = Ioa_WriteAigerEncode(pBuffer,iVar10,*(int *)((long)pvVar3 + 0x28) * 2 - uVar2);
      lVar7 = (ulong)uVar1 - (ulong)uVar8;
      lVar5 = -lVar7;
      if (0 < lVar7) {
        lVar5 = lVar7;
      }
      iVar10 = Ioa_WriteAigerEncode(pBuffer,iVar10,(uint)lVar5);
      if ((int)lVar6 + 0x5a < iVar10) {
        puts(
            "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
            );
        goto LAB_0060a9e8;
      }
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact )
{
//    Bar_Progress_t * pProgress;
    FILE * pFile;
    Aig_Obj_t * pObj, * pDriver;
    int i, nNodes, nBufferSize, Pos;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    if ( Aig_ManCoNum(pMan) == 0 )
    {
        printf( "AIG cannot be written because it has no POs.\n" );
        return;
    }

//    assert( Aig_ManIsStrash(pMan) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Ioa_WriteAiger(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
/*
    Aig_ManForEachLatch( pMan, pObj, i )
        if ( !Aig_LatchIsInit0(pObj) )
        {
            fprintf( stdout, "Ioa_WriteAiger(): Cannot write AIGER format with non-0 latch init values. Run \"zero\".\n" );
            return;
        }
*/
    // set the node numbers to be used in the output file
    nNodes = 0;
    Ioa_ObjSetAigerNum( Aig_ManConst1(pMan), nNodes++ );
    Aig_ManForEachCi( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );
    Aig_ManForEachNode( pMan, pObj, i )
        Ioa_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    fprintf( pFile, "aig%s %u %u %u %u %u", 
        fCompact? "2" : "",
        Aig_ManCiNum(pMan) + Aig_ManNodeNum(pMan), 
        Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManRegNum(pMan),
        Aig_ManConstrNum(pMan) ? 0 : Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan),
        Aig_ManNodeNum(pMan) );
    // write the extended header "B C J F"
    if ( Aig_ManConstrNum(pMan) )
        fprintf( pFile, " %u %u", Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan), Aig_ManConstrNum(pMan) );
    fprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    Aig_ManInvertConstraints( pMan );
    if ( !fCompact ) 
    {
        // write latch drivers
        Aig_ManForEachLiSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }

        // write PO drivers
        Aig_ManForEachPoSeq( pMan, pObj, i )
        {
            pDriver = Aig_ObjFanin0(pObj);
            fprintf( pFile, "%u\n", Ioa_ObjMakeLit( Ioa_ObjAigerNum(pDriver), Aig_ObjFaninC0(pObj) ^ (Ioa_ObjAigerNum(pDriver) == 0) ) );
        }
    }
    else
    {
        Vec_Int_t * vLits = Ioa_WriteAigerLiterals( pMan );
        Vec_Str_t * vBinary = Ioa_WriteEncodeLiterals( vLits );
        fwrite( Vec_StrArray(vBinary), 1, Vec_StrSize(vBinary), pFile );
        Vec_StrFree( vBinary );
        Vec_IntFree( vLits );
    }
    Aig_ManInvertConstraints( pMan );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Aig_ManNodeNum(pMan) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
//    pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(pMan) );
    Aig_ManForEachNode( pMan, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit  = Ioa_ObjMakeLit( Ioa_ObjAigerNum(pObj), 0 );
        uLit0 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj) );
        uLit1 = Ioa_ObjMakeLit( Ioa_ObjAigerNum(Aig_ObjFanin1(pObj)), Aig_ObjFaninC1(pObj) );
        assert( uLit0 != uLit1 );
        if ( uLit0 > uLit1 )
        {
            int Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Ioa_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Ioa_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
            fclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
//    Bar_ProgressStop( pProgress );

    // write the buffer
    fwrite( pBuffer, 1, Pos, pFile );
    ABC_FREE( pBuffer );
/*
    // write the symbol table
    if ( fWriteSymbols )
    {
        int bads;
        // write PIs
        Aig_ManForEachPiSeq( pMan, pObj, i )
            fprintf( pFile, "i%d %s\n", i, Aig_ObjName(pObj) );
        // write latches
        Aig_ManForEachLoSeq( pMan, pObj, i )
            fprintf( pFile, "l%d %s\n", i, Aig_ObjName(Aig_ObjFanout0(pObj)) );
        // write POs
        bads = Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) - Aig_ManConstrNum(pMan);
        Aig_ManForEachPoSeq( pMan, pObj, i )
            if ( !Aig_ManConstrNum(pMan) )
                fprintf( pFile, "o%d %s\n", i, Aig_ObjName(pObj) );
            else if ( i < bads )
                fprintf( pFile, "b%d %s\n", i, Aig_ObjName(pObj) );
            else
                fprintf( pFile, "c%d %s\n", i - bads, Aig_ObjName(pObj) );
    }
*/
    // write the comment
    fprintf( pFile, "c" );
    if ( pMan->pName )
        fprintf( pFile, "n%s%c", pMan->pName, '\0' );
    fprintf( pFile, "\nThis file was produced by the IOA package in ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
    fclose( pFile );
}